

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

shared_ptr<Buffer> __thiscall QPDFObjectHandle::getRawStreamData(QPDFObjectHandle *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  typed in_SIL;
  shared_ptr<Buffer> sVar1;
  QPDFObjectHandle local_20;
  
  as_stream(&local_20,in_SIL);
  ::qpdf::Stream::getRawStreamData((Stream *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Buffer>)sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Buffer>
QPDFObjectHandle::getRawStreamData()
{
    return as_stream(error).getRawStreamData();
}